

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.hpp
# Opt level: O1

void __thiscall TasGrid::GridSequence::loadGpuSurpluses<float>(GridSequence *this)

{
  CudaSequenceData<float> *this_00;
  double *cpu_data;
  pointer __p;
  pointer __p_00;
  __uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
  local_20;
  
  if ((this->gpu_cachef)._M_t.
      super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
      .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl ==
      (CudaSequenceData<float> *)0x0) {
    __p_00 = (pointer)operator_new(0x50);
    (__p_00->surpluses).num_entries = 0;
    (__p_00->surpluses).gpu_data = (float *)0x0;
    (__p_00->nodes).num_entries = 0;
    (__p_00->nodes).gpu_data = (float *)0x0;
    (__p_00->coeff).num_entries = 0;
    (__p_00->coeff).gpu_data = (float *)0x0;
    (__p_00->num_nodes).num_entries = 0;
    (__p_00->num_nodes).gpu_data = (int *)0x0;
    (__p_00->points).num_entries = 0;
    (__p_00->points).gpu_data = (int *)0x0;
    local_20._M_t.
    super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
    .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl =
         (tuple<TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
          )(_Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
            )0x0;
    std::
    __uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
    ::reset((__uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
             *)&this->gpu_cachef,__p_00);
    ::std::
    unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
    ::~unique_ptr((unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                   *)&local_20);
  }
  this_00 = (this->gpu_cachef)._M_t.
            super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
            .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl;
  if ((this_00->surpluses).num_entries == 0) {
    cpu_data = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    GpuVector<float>::load<double>
              (&this_00->surpluses,(this->super_BaseCanonicalGrid).acceleration,
               (long)(this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)cpu_data >> 3,cpu_data);
  }
  return;
}

Assistant:

void loadGpuSurpluses() const{
        auto& ccache = getGpuCache<T>();
        if (!ccache) ccache = Utils::make_unique<CudaSequenceData<T>>();
        if (ccache->surpluses.empty()) ccache->surpluses.load(acceleration, surpluses.begin(), surpluses.end());
    }